

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O1

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::CalculateQ
          (ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_> *this,
          ChState *stateA_x,ChStateDelta *stateA_w,ChState *stateB_x,ChStateDelta *stateB_w,
          ChMaterialCompositeSMC *mat,ChVectorDynamic<> *Q)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChContactable_1vars<6> *pCVar3;
  undefined8 uVar4;
  bool bVar5;
  ChState *pCVar6;
  uint uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChVector<double> p2_abs;
  ChVector<double> p1_abs;
  ChVector<double> vel1;
  ChVector<double> p2_loc;
  ChVector<double> p1_loc;
  ChVector<double> force;
  ChVector<double> vel2;
  ChVector<double> local_170;
  double local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  double local_138;
  ChStateDelta *local_130;
  ChStateDelta *local_128;
  ChMaterialCompositeSMC *local_120;
  ChState *local_118;
  double local_110;
  double local_108;
  double local_100;
  ChCoordsys<double> local_f8;
  ChVector<double> local_c0;
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [16];
  undefined8 local_68;
  ChVector<double> local_60;
  ChVector<double> local_48;
  undefined1 extraout_var [56];
  
  local_130 = stateA_w;
  local_128 = stateB_w;
  local_120 = mat;
  (*(((this->super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
     objA)->super_ChContactable)._vptr_ChContactable[0xb])(&local_f8);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_f8,
             &(this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
              .p1);
  (*(((this->super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
     objB)->super_ChContactable)._vptr_ChContactable[0xb])(&local_f8);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_f8,
             &(this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
              .p2);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objA;
  local_118 = stateA_x;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[8])(&local_f8,pCVar3,local_90,stateA_x);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objB;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[8])(&local_110,pCVar3,local_a8,stateB_x);
  local_170.m_data[0] = local_f8.pos.m_data[0] - local_110;
  local_170.m_data[1] = local_f8.pos.m_data[1] - local_108;
  local_170.m_data[2] = local_f8.pos.m_data[2] - local_100;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_170.m_data[1] * local_170.m_data[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_170.m_data[0];
  auVar9 = vfmadd231sd_fma(auVar9,auVar19,auVar19);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_170.m_data[2];
  auVar9 = vfmadd231sd_fma(auVar9,auVar18,auVar18);
  if (auVar9._0_8_ < 0.0) {
    local_158 = local_170.m_data[2];
    local_148 = local_170.m_data[1];
    local_138 = local_170.m_data[0];
    dVar8 = sqrt(auVar9._0_8_);
    local_170.m_data[0] = local_138;
    local_170.m_data[1] = local_148;
    local_170.m_data[2] = local_158;
  }
  else {
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar8 = auVar9._0_8_;
  }
  if (dVar8 < 2.2250738585072014e-308) {
    local_170.m_data[0] = 1.0;
    local_170.m_data[1] = 0.0;
    local_170.m_data[2] = 0.0;
  }
  else {
    dVar8 = 1.0 / dVar8;
    local_170.m_data[0] = local_170.m_data[0] * dVar8;
    local_170.m_data[1] = local_170.m_data[1] * dVar8;
    local_170.m_data[2] = local_170.m_data[2] * dVar8;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (local_f8.pos.m_data[1] - local_108) * (local_f8.pos.m_data[1] - local_108);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_f8.pos.m_data[0] - local_110;
  auVar9 = vfmadd231sd_fma(auVar10,auVar15,auVar15);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_f8.pos.m_data[2] - local_100;
  auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar13);
  if (auVar9._0_8_ < 0.0) {
    auVar12._0_8_ = sqrt(auVar9._0_8_);
    auVar12._8_56_ = extraout_var;
    auVar9 = auVar12._0_16_;
  }
  else {
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
  }
  pCVar6 = local_118;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_170.m_data[0];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->
                 super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                 ).normal.m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_170.m_data[1] *
       (this->super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
       .normal.m_data[1];
  auVar18 = vfmadd231sd_fma(auVar14,auVar16,auVar1);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_170.m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->
                 super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                 ).normal.m_data[2];
  auVar18 = vfmadd132sd_fma(auVar17,auVar18,auVar2);
  local_148 = -0.0;
  uStack_140 = 0x8000000000000000;
  uStack_150 = auVar9._8_8_;
  uVar4 = vcmpsd_avx512f(auVar18,ZEXT816(0) << 0x40,1);
  bVar5 = (bool)((byte)uVar4 & 1);
  local_158 = (double)((ulong)bVar5 * (auVar9._0_8_ ^ 0x8000000000000000) +
                      (ulong)!bVar5 * auVar9._0_8_);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objA;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[9])
            (&local_c0,pCVar3,local_90,local_118,local_130);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objB;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[9])
            (&local_48,pCVar3,local_a8,stateB_x,local_128);
  CalculateForce(&local_60,this,local_158,&local_170,&local_c0,&local_48,local_120);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objA;
  auVar11._0_4_ = SUB84(local_60.m_data[2],0) ^ (uint)local_148;
  auVar11._4_4_ = (uint)((ulong)local_60.m_data[2] >> 0x20) ^ local_148._4_4_;
  auVar11._8_4_ = (uint)uStack_140;
  auVar11._12_4_ = uStack_140._4_4_;
  local_78._0_4_ = (uint)local_148 ^ local_60.m_data[0]._0_4_;
  local_78._4_4_ = local_148._4_4_ ^ local_60.m_data[0]._4_4_;
  local_78._8_4_ = (uint)uStack_140 ^ local_60.m_data[1]._0_4_;
  local_78._12_4_ = uStack_140._4_4_ ^ local_60.m_data[1]._4_4_;
  local_68 = vmovlps_avx(auVar11);
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[0xd])(pCVar3,local_78,&local_f8,pCVar6,Q,0);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objB;
  uVar7 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
             .objA)->super_ChContactable)._vptr_ChContactable[4])();
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[0xd])
            (pCVar3,&local_60,&local_110,stateB_x,Q,(ulong)uVar7);
  return;
}

Assistant:

void CalculateQ(const ChState& stateA_x,            ///< state positions for objA
                    const ChStateDelta& stateA_w,       ///< state velocities for objA
                    const ChState& stateB_x,            ///< state positions for objB
                    const ChStateDelta& stateB_w,       ///< state velocities for objB
                    const ChMaterialCompositeSMC& mat,  ///< composite material for contact pair
                    ChVectorDynamic<>& Q                ///< output generalized forces
    ) {
        // Express contact points in local frames.
        // We assume that these points remain fixed to their respective contactable objects.
        ChVector<> p1_loc = this->objA->GetCsysForCollisionModel().TransformPointParentToLocal(this->p1);
        ChVector<> p2_loc = this->objB->GetCsysForCollisionModel().TransformPointParentToLocal(this->p2);

        // Express the local points in global frame
        ChVector<> p1_abs = this->objA->GetContactPoint(p1_loc, stateA_x);
        ChVector<> p2_abs = this->objB->GetContactPoint(p2_loc, stateB_x);

        /*
            Note: while this can be somewhat justified for a ChBody, it will not work
                  for a mesh vertex for instance...

        // Project the points onto the unperturbed normal line
        p1_abs = this->p1 + Vdot(p1_abs - this->p1, this->normal) * this->normal;
        p2_abs = this->p2 + Vdot(p2_abs - this->p2, this->normal) * this->normal;
        */

        // Calculate normal direction (expressed in global frame)
        ChVector<> normal_dir = (p1_abs - p2_abs).GetNormalized();

        // Calculate penetration depth
        double delta = (p1_abs - p2_abs).Length();

        // If the normal direction flipped sign, change sign of delta
        if (Vdot(normal_dir, this->normal) < 0)
            delta = -delta;

        // Calculate velocity of contact points (expressed in global frame)
        ChVector<> vel1 = this->objA->GetContactPointSpeed(p1_loc, stateA_x, stateA_w);
        ChVector<> vel2 = this->objB->GetContactPointSpeed(p2_loc, stateB_x, stateB_w);

        // Compute the contact force.
        ChVector<> force = CalculateForce(delta, normal_dir, vel1, vel2, mat);

        // Compute and load the generalized contact forces.
        this->objA->ContactForceLoadQ(-force, p1_abs, stateA_x, Q, 0);
        this->objB->ContactForceLoadQ(force, p2_abs, stateB_x, Q, this->objA->ContactableGet_ndof_w());
    }